

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O0

IterateResult __thiscall gl3cts::TextureSwizzle::APIErrorsTest::iterate(APIErrorsTest *this)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestContext *this_00;
  GLint local_88 [2];
  GLint local_80 [4];
  ulong uStack_70;
  GLint value_3;
  size_t j_3;
  GLint param [4];
  ulong uStack_50;
  GLint value_2;
  size_t j_2;
  size_t i_1;
  GLint value_1;
  GLenum state_1;
  size_t j_1;
  GLint value;
  GLenum state;
  size_t j;
  size_t i;
  Functions *gl;
  APIErrorsTest *this_local;
  long lVar4;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar4 + 0x6f8))(1,&this->m_id);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"GenTextures",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0x898);
  (**(code **)(lVar4 + 0xb8))(0x8513,this->m_id);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0x89b);
  for (j = 0; j < 4; j = j + 1) {
    for (_value = 0; _value < 6; _value = _value + 1) {
      (**(code **)(lVar4 + 0x1360))
                (0x8513,*(undefined4 *)(states + j * 4),*(undefined4 *)(valid_values + _value * 4));
      verifyError(this,0);
    }
    for (_value_1 = 0; _value_1 < 4; _value_1 = _value_1 + 1) {
      (**(code **)(lVar4 + 0x1360))
                (0x8513,*(undefined4 *)(states + j * 4),iterate::invalid_values[_value_1]);
      verifyError(this,0x500);
    }
  }
  for (j_2 = 0; j_2 < 4; j_2 = j_2 + 1) {
    for (uStack_50 = 0; uStack_50 < 6; uStack_50 = uStack_50 + 1) {
      param[3] = *(GLint *)(valid_values + uStack_50 * 4);
      j_3 = 0x190400001903;
      param[0] = 0x1905;
      param[1] = 0x1906;
      param[j_2 - 2] = param[3];
      (**(code **)(lVar4 + 0x1368))(0x8513,0x8e46,&j_3);
      verifyError(this,0);
    }
    for (uStack_70 = 0; uStack_70 < 4; uStack_70 = uStack_70 + 1) {
      local_80[3] = iterate::invalid_values[uStack_70];
      local_88[0] = 0x1903;
      local_88[1] = 0x1904;
      local_80[0] = 0x1905;
      local_80[1] = 0x1906;
      local_80[j_2 - 2] = local_80[3];
      (**(code **)(lVar4 + 0x1368))(0x8513,0x8e46,local_88);
      verifyError(this,0x500);
    }
  }
  this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
  tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,"Pass");
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult APIErrorsTest::iterate()
{
	static const glw::GLint invalid_values[] = { 0x1902, 0x1907, -1, 2 };
	static const size_t		n_invalid_values = sizeof(invalid_values) / sizeof(invalid_values[0]);

	/*  */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.genTextures(1, &m_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GenTextures");

	gl.bindTexture(GL_TEXTURE_CUBE_MAP, m_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

	/*
	 * - INVALID_ENUM is generated by TexParameter* routines when <pname> is
	 * one of [TEXTURE_SWIZZLE_R, TEXTURE_SWIZZLE_G, TEXTURE_SWIZZLE_B,
	 * TEXTURE_SWIZZLE_A] and <param> is not one of [RED, GREEN, BLUE, ALPHA, ZERO,
	 * ONE];
	 */
	for (size_t i = 0; i < n_states; ++i)
	{
		for (size_t j = 0; j < n_valid_values; ++j)
		{
			const glw::GLenum state = states[i];
			const glw::GLint  value = valid_values[j];

			gl.texParameteri(GL_TEXTURE_CUBE_MAP, state, value);
			verifyError(GL_NO_ERROR);
		}

		for (size_t j = 0; j < n_invalid_values; ++j)
		{
			const glw::GLenum state = states[i];
			const glw::GLint  value = invalid_values[j];

			gl.texParameteri(GL_TEXTURE_CUBE_MAP, state, value);
			verifyError(GL_INVALID_ENUM);
		}
	}

	/*
	 * - INVALID_ENUM is generated by TexParameter*v routines when <pname> is
	 * TEXTURE_SWIZZLE_RGBA and any of four values pointed by <param> is not one of
	 * [RED, GREEN, BLUE, ALPHA, ZERO, ONE].
	 */
	for (size_t i = 0; i < 4 /* number of channels */; ++i)
	{
		for (size_t j = 0; j < n_valid_values; ++j)
		{
			const glw::GLint value = valid_values[j];

			glw::GLint param[4] = { GL_RED, GL_GREEN, GL_BLUE, GL_ALPHA };

			param[i] = value;

			gl.texParameteriv(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_SWIZZLE_RGBA, param);
			verifyError(GL_NO_ERROR);
		}

		for (size_t j = 0; j < n_invalid_values; ++j)
		{
			const glw::GLint value = invalid_values[j];

			glw::GLint param[4] = { GL_RED, GL_GREEN, GL_BLUE, GL_ALPHA };

			param[i] = value;

			gl.texParameteriv(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_SWIZZLE_RGBA, param);
			verifyError(GL_INVALID_ENUM);
		}
	}

	/* Set result - exceptions are thrown in case of any error */
	m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");

	/* Done */
	return STOP;
}